

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

pos sel_spread_half(Terminal *term,pos p,wchar_t dir)

{
  anon_enum_32 aVar1;
  pos pVar2;
  short sVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  termline *ptVar7;
  bool bVar8;
  int local_bc;
  wchar_t local_b8;
  wchar_t local_a8;
  wchar_t local_98;
  wchar_t local_88;
  int local_78;
  wchar_t maxcols_1;
  termline *ldata2_1;
  termline *ldata2;
  termchar *ptStack_40;
  wchar_t maxcols;
  termchar *q;
  wchar_t topy;
  short wvalue;
  termline *ldata;
  wchar_t dir_local;
  Terminal *term_local;
  pos p_local;
  
  wVar4 = sblines(term);
  term_local._0_4_ = p.y;
  _topy = lineptr(term,(wchar_t)term_local,L'᪜',L'\0');
  aVar1 = term->selmode;
  term_local._4_4_ = p.x;
  if (aVar1 == LEXICOGRAPHIC) {
    pVar2 = p;
    if ((_topy->lattr & 0x10) == 0) {
      ptStack_40 = _topy->chars;
      wVar4 = line_cols(term,_topy);
      ptStack_40 = ptStack_40 + wVar4;
      while( true ) {
        bVar8 = false;
        if ((_topy->chars < ptStack_40) &&
           ((ptStack_40[-1].chr == 0x20 ||
            ((bVar8 = false, (ptStack_40[-1].chr & 0xfffffc00) == 0xd800 &&
             (bVar8 = false, (ptStack_40[-1].chr & 0xff) == 0x20)))))) {
          bVar8 = ptStack_40[-1].cc_next == L'\0';
        }
        if (!bVar8) break;
        ptStack_40 = ptStack_40 + -1;
      }
      if (ptStack_40 == _topy->chars + term->cols) {
        ptStack_40 = ptStack_40 + -1;
      }
      pVar2 = p;
      if ((long)ptStack_40 - (long)_topy->chars >> 5 <= (long)term_local._4_4_) {
        if (dir == L'\xffffffff') {
          local_78 = (int)((long)ptStack_40 - (long)_topy->chars >> 5);
        }
        else {
          local_78 = term->cols + L'\xffffffff';
        }
        term_local = (Terminal *)CONCAT44(local_78,(wchar_t)term_local);
        pVar2 = (pos)term_local;
      }
    }
  }
  else if (aVar1 == ABOUT_TO) {
    if ((term_local._4_4_ < L'\x01') || (_topy->chars[term_local._4_4_].chr != 0xdfff)) {
      local_88 = (wchar_t)_topy->chars[term_local._4_4_].chr;
    }
    else {
      local_88 = (wchar_t)_topy->chars[term_local._4_4_ + L'\xffffffff'].chr;
    }
    wVar5 = wordtype(term,local_88);
    sVar3 = (short)wVar5;
    term_local = (Terminal *)p;
    if (dir == L'\x01') {
      while( true ) {
        while( true ) {
          wVar4 = line_cols(term,_topy);
          pVar2 = (pos)term_local;
          if (wVar4 + L'\xffffffff' <= term_local._4_4_) break;
          if ((term_local._4_4_ + 1 < 1) || (_topy->chars[term_local._4_4_ + 1].chr != 0xdfff)) {
            local_98 = (wchar_t)_topy->chars[term_local._4_4_ + 1].chr;
          }
          else {
            local_98 = (wchar_t)_topy->chars[term_local._4_4_].chr;
          }
          wVar4 = wordtype(term,local_98);
          if (wVar4 != sVar3) goto LAB_0011ba6b;
          term_local = (Terminal *)CONCAT44(term_local._4_4_ + 1,(wchar_t)term_local);
        }
        if ((term->rows <= (wchar_t)term_local + L'\x01') || ((_topy->lattr & 0x10) == 0))
        goto LAB_0011ba6b;
        ptVar7 = lineptr(term,(wchar_t)term_local + L'\x01',L'᫁',L'\0');
        wVar4 = wordtype(term,(wchar_t)ptVar7->chars->chr);
        if (wVar4 != sVar3) break;
        term_local = (Terminal *)(ulong)(uint)((wchar_t)term_local + 1);
        unlineptr(_topy);
        _topy = ptVar7;
      }
      unlineptr(ptVar7);
    }
    else {
      while( true ) {
        while( true ) {
          pVar2 = (pos)term_local;
          if (term_local._4_4_ < 1) break;
          if ((term_local._4_4_ + -1 < 1) || (_topy->chars[term_local._4_4_ + -1].chr != 0xdfff)) {
            local_a8 = (wchar_t)_topy->chars[term_local._4_4_ + -1].chr;
          }
          else {
            local_a8 = (wchar_t)_topy->chars[term_local._4_4_ + -2].chr;
          }
          wVar5 = wordtype(term,local_a8);
          if (wVar5 != sVar3) goto LAB_0011ba6b;
          term_local = (Terminal *)CONCAT44(term_local._4_4_ + -1,(wchar_t)term_local);
        }
        if ((wchar_t)term_local <= -wVar4) goto LAB_0011ba6b;
        ptVar7 = lineptr(term,(wchar_t)term_local + L'\xffffffff',L'᫜',L'\0');
        wVar5 = line_cols(term,ptVar7);
        if ((ptVar7->lattr & 0x10) == 0) goto LAB_0011ba6b;
        if ((wVar5 + L'\xffffffff' < 1) || (ptVar7->chars[wVar5 + L'\xffffffff'].chr != 0xdfff)) {
          local_b8 = (wchar_t)ptVar7->chars[wVar5 + L'\xffffffff'].chr;
        }
        else {
          local_b8 = (wchar_t)ptVar7->chars[wVar5 + L'\xfffffffe'].chr;
        }
        wVar6 = wordtype(term,local_b8);
        if (wVar6 != sVar3) break;
        term_local = (Terminal *)CONCAT44(wVar5 + L'\xffffffff',(wchar_t)term_local + -1);
        unlineptr(_topy);
        _topy = ptVar7;
      }
      unlineptr(ptVar7);
    }
  }
  else {
    pVar2 = p;
    if (aVar1 == DRAGGING) {
      if (dir == L'\xffffffff') {
        local_bc = 0;
      }
      else {
        local_bc = term->cols + L'\xffffffff';
      }
      term_local = (Terminal *)CONCAT44(local_bc,(wchar_t)term_local);
      pVar2 = (pos)term_local;
    }
  }
LAB_0011ba6b:
  term_local = (Terminal *)pVar2;
  unlineptr(_topy);
  return (pos)term_local;
}

Assistant:

static pos sel_spread_half(Terminal *term, pos p, int dir)
{
    termline *ldata;
    short wvalue;
    int topy = -sblines(term);

    ldata = lineptr(p.y);

    switch (term->selmode) {
      case SM_CHAR:
        /*
         * In this mode, every character is a separate unit, except
         * for runs of spaces at the end of a non-wrapping line.
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            termchar *q = ldata->chars + line_cols(term, ldata);
            while (q > ldata->chars &&
                   IS_SPACE_CHR(q[-1].chr) && !q[-1].cc_next)
                q--;
            if (q == ldata->chars + term->cols)
                q--;
            if (p.x >= q - ldata->chars)
                p.x = (dir == -1 ? q - ldata->chars : term->cols - 1);
        }
        break;
      case SM_WORD:
        /*
         * In this mode, the units are maximal runs of characters
         * whose `wordness' has the same value.
         */
        wvalue = wordtype(term, UCSGET(ldata->chars, p.x));
        if (dir == +1) {
            while (1) {
                int maxcols = line_cols(term, ldata);
                if (p.x < maxcols-1) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x+1)) == wvalue)
                        p.x++;
                    else
                        break;
                } else {
                    if (p.y+1 < term->rows &&
                        (ldata->lattr & LATTR_WRAPPED)) {
                        termline *ldata2;
                        ldata2 = lineptr(p.y+1);
                        if (wordtype(term, UCSGET(ldata2->chars, 0))
                            == wvalue) {
                            p.x = 0;
                            p.y++;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        } else {
            while (1) {
                if (p.x > 0) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x-1)) == wvalue)
                        p.x--;
                    else
                        break;
                } else {
                    termline *ldata2;
                    int maxcols;
                    if (p.y <= topy)
                        break;
                    ldata2 = lineptr(p.y-1);
                    maxcols = line_cols(term, ldata2);
                    if (ldata2->lattr & LATTR_WRAPPED) {
                        if (wordtype(term, UCSGET(ldata2->chars, maxcols-1))
                            == wvalue) {
                            p.x = maxcols-1;
                            p.y--;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        }
        break;
      case SM_LINE:
        /*
         * In this mode, every line is a unit.
         */
        p.x = (dir == -1 ? 0 : term->cols - 1);
        break;
    }

    unlineptr(ldata);
    return p;
}